

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.h
# Opt level: O0

unsigned_short __thiscall vm_meta_entry_t::xlat_prop(vm_meta_entry_t *this,vm_prop_id_t prop)

{
  vm_prop_id_t prop_local;
  vm_meta_entry_t *this_local;
  unsigned_short local_2;
  
  if ((prop < this->min_prop_) || ((ulong)this->min_prop_ + this->prop_xlat_cnt_ <= (ulong)prop)) {
    local_2 = 0;
  }
  else {
    local_2 = this->prop_xlat_[(int)((uint)prop - (uint)this->min_prop_)];
  }
  return local_2;
}

Assistant:

unsigned short xlat_prop(vm_prop_id_t prop) const
    {
        /*
         *   Check to see if the property is represented in the table.  If
         *   it's not within the range of properties in the table, there
         *   is no translation for the property.  
         */
        if (prop < min_prop_ || prop >= min_prop_ + prop_xlat_cnt_)
        {
            /* the property isn't in the table, so it has no translation */
            return 0;
        }
        
        /* return the function index from the table */
        return prop_xlat_[prop - min_prop_];
    }